

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

CURLcode Curl_resolver_is_resolved(connectdata *conn,Curl_dns_entry **entry)

{
  int iVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  CURLcode CVar6;
  curltime cVar7;
  curltime newer;
  curltime older;
  long local_40;
  timediff_t elapsed;
  CURLcode result;
  int done;
  thread_data *td;
  Curl_easy *data;
  Curl_dns_entry **entry_local;
  connectdata *conn_local;
  
  pCVar2 = conn->data;
  pvVar3 = (conn->async).os_specific;
  *entry = (Curl_dns_entry *)0x0;
  if (pvVar3 == (void *)0x0) {
    conn_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
    iVar1 = *(int *)((long)pvVar3 + 0x20);
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
    if (iVar1 == 0) {
      cVar7 = Curl_now();
      uVar4 = (pCVar2->progress).t_startsingle.tv_sec;
      uVar5 = (pCVar2->progress).t_startsingle.tv_usec;
      older.tv_usec = uVar5;
      older.tv_sec = uVar4;
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar7._0_12_,0);
      newer.tv_usec = SUB124(cVar7._0_12_,8);
      older._12_4_ = 0;
      local_40 = Curl_timediff(newer,older);
      if (local_40 < 0) {
        local_40 = 0;
      }
      if (*(int *)((long)pvVar3 + 8) == 0) {
        *(undefined4 *)((long)pvVar3 + 8) = 1;
      }
      else if (*(long *)((long)pvVar3 + 0x10) <= local_40) {
        *(int *)((long)pvVar3 + 8) = *(int *)((long)pvVar3 + 8) << 1;
      }
      if (0xfa < *(uint *)((long)pvVar3 + 8)) {
        *(undefined4 *)((long)pvVar3 + 8) = 0xfa;
      }
      *(ulong *)((long)pvVar3 + 0x10) = local_40 + (ulong)*(uint *)((long)pvVar3 + 8);
      Curl_expire(conn->data,(ulong)*(uint *)((long)pvVar3 + 8),EXPIRE_ASYNC_NAME);
    }
    else {
      getaddrinfo_complete(conn);
      if ((conn->async).dns == (Curl_dns_entry *)0x0) {
        CVar6 = resolver_error(conn);
        destroy_async_data(&conn->async);
        return CVar6;
      }
      destroy_async_data(&conn->async);
      *entry = (conn->async).dns;
    }
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct Curl_easy *data = conn->data;
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  int done = 0;

  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(conn);

    if(!conn->async.dns) {
      CURLcode result = resolver_error(conn);
      destroy_async_data(&conn->async);
      return result;
    }
    destroy_async_data(&conn->async);
    *entry = conn->async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(conn->data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}